

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O2

int Llb_CoreReachability_int(Llb_Img_t *p,Vec_Ptr_t *vQuant0,Vec_Ptr_t *vQuant1)

{
  int *Permute;
  int *Permute_00;
  int *Permute_01;
  long TimeOut;
  Vec_Ptr_t *pVVar1;
  bool bVar2;
  FILE *pFVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  abctime aVar7;
  abctime aVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  DdNode *pDVar11;
  abctime aVar12;
  void **ppvVar13;
  DdNode *n;
  Gia_ParLlb_t *pGVar14;
  Abc_Cex_t *pAVar15;
  uint uVar16;
  abctime time;
  abctime time_00;
  abctime time_01;
  abctime time_02;
  char *pcVar17;
  DdManager *pDVar18;
  uint uVar19;
  bool bVar20;
  double dVar21;
  double dVar22;
  
  bVar20 = p->pPars->fBackward == 0;
  bVar2 = !bVar20;
  Permute = (&p->vGlo2Cs)[bVar2]->pArray;
  Permute_00 = (&p->vCs2Glo)[bVar20]->pArray;
  Permute_01 = (&p->vCs2Glo)[bVar2]->pArray;
  aVar7 = Abc_Clock();
  aVar8 = Abc_Clock();
  pGVar14 = p->pPars;
  TimeOut = pGVar14->TimeTarget;
  if (TimeOut < aVar8) {
    if (pGVar14->fSilent == 0) {
      printf("Reached timeout (%d seconds) before image computation.\n",
             (ulong)(uint)pGVar14->TimeLimit);
      pGVar14 = p->pPars;
    }
    pGVar14->iFrame = -1;
    return -1;
  }
  p->dd->TimeStop = TimeOut;
  p->ddG->TimeStop = TimeOut;
  pDVar18 = p->ddR;
  pDVar18->TimeStop = TimeOut;
  iVar4 = pGVar14->fBackward;
  pDVar9 = Llb_BddComputeBad(p->pInit,pDVar18,TimeOut);
  if (iVar4 == 0) {
    p->ddR->bFunc = pDVar9;
    if (pDVar9 != (DdNode *)0x0) {
      Cudd_Ref(pDVar9);
      pDVar9 = Llb_CoreComputeCube(p->dd,p->vVarsCs,1,(char *)0x0);
      Cudd_Ref(pDVar9);
      pDVar11 = Llb_CoreComputeCube(p->ddG,p->vVarsCs,0,(char *)0x0);
      pDVar10 = pDVar11;
LAB_006620bc:
      Cudd_Ref(pDVar11);
      pGVar14 = p->pPars;
      iVar4 = pGVar14->nIterMax;
      uVar16 = 0xffffffff;
      do {
        uVar19 = uVar16;
        uVar16 = uVar19 + 1;
        if (iVar4 <= (int)uVar16) {
          if (pDVar10 == (DdNode *)0x0) goto LAB_006627ac;
          if (pDVar9 != (DdNode *)0x0) {
            Cudd_RecursiveDeref(p->dd,pDVar9);
            pGVar14 = p->pPars;
          }
          goto LAB_006625b3;
        }
        aVar8 = Abc_Clock();
        if (p->pPars->TimeLimit != 0) {
          aVar12 = Abc_Clock();
          pGVar14 = p->pPars;
          if (aVar12 <= pGVar14->TimeTarget) goto LAB_00662105;
          if (pGVar14->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation.\n",
                   (ulong)(uint)pGVar14->TimeLimit);
            pGVar14 = p->pPars;
          }
          pGVar14->iFrame = uVar19;
LAB_006627d4:
          pDVar18 = p->dd;
LAB_006627db:
          Cudd_RecursiveDeref(pDVar18,pDVar9);
          pDVar18 = p->ddG;
          goto LAB_006627e7;
        }
LAB_00662105:
        pDVar11 = Extra_TransferPermute(p->dd,p->ddR,pDVar9,Permute_01);
        if (pDVar11 == (DdNode *)0x0) {
          pGVar14 = p->pPars;
          if (pGVar14->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation.\n",
                   (ulong)(uint)pGVar14->TimeLimit);
            pGVar14 = p->pPars;
          }
          pGVar14->iFrame = uVar19;
          goto LAB_006627d4;
        }
        Cudd_Ref(pDVar11);
        pVVar1 = p->vRings;
        iVar4 = pVVar1->nSize;
        if (iVar4 == pVVar1->nCap) {
          uVar5 = iVar4 * 2;
          if (iVar4 < 0x10) {
            uVar5 = 0x10;
          }
          if (iVar4 < (int)uVar5) {
            if (pVVar1->pArray == (void **)0x0) {
              ppvVar13 = (void **)malloc((ulong)uVar5 << 3);
            }
            else {
              ppvVar13 = (void **)realloc(pVVar1->pArray,(ulong)uVar5 << 3);
              iVar4 = pVVar1->nSize;
            }
            pVVar1->pArray = ppvVar13;
            pVVar1->nCap = uVar5;
          }
        }
        pVVar1->nSize = iVar4 + 1;
        pVVar1->pArray[iVar4] = pDVar11;
        pGVar14 = p->pPars;
        if (pGVar14->fSkipOutCheck == 0) {
          iVar4 = Cudd_bddLeq(p->ddR,pDVar11,(DdNode *)((ulong)p->ddR->bFunc ^ 1));
          if (iVar4 == 0) {
            if (p->pInit->pSeqModel == (Abc_Cex_t *)0x0) {
              if (p->pPars->fBackward == 0) {
                pAVar15 = Llb_CoreDeriveCex(p);
                p->pInit->pSeqModel = pAVar15;
              }
              Cudd_RecursiveDeref(p->dd,pDVar9);
              pDVar18 = p->ddG;
              Cudd_RecursiveDeref(pDVar18,pDVar10);
              pGVar14 = p->pPars;
              if (pGVar14->fSilent == 0) {
                if (pGVar14->fBackward == 0) {
                  Abc_Print((int)pDVar18,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                            (ulong)(uint)p->pInit->pSeqModel->iPo,p->pInit->pName);
                }
                else {
                  Abc_Print((int)pDVar18,
                            "Output ??? was asserted in frame %d (counter-example is not produced).  "
                            ,(ulong)(uVar19 + 1));
                }
                aVar8 = Abc_Clock();
                Abc_PrintTime(0x77b9b0,(char *)(aVar8 - aVar7),time_02);
                pGVar14 = p->pPars;
              }
              pGVar14->iFrame = uVar19;
              return 0;
            }
            __assert_fail("p->pInit->pSeqModel == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Core.c"
                          ,0x13e,
                          "int Llb_CoreReachability_int(Llb_Img_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
          }
          pGVar14 = p->pPars;
        }
        pDVar11 = Llb_ImgComputeImage(p->pAig,p->vDdMans,p->dd,pDVar9,vQuant0,vQuant1,p->vDriRefs,
                                      pGVar14->TimeTarget,pGVar14->fBackward,pGVar14->fReorder,
                                      pGVar14->fVeryVerbose);
        if (pDVar11 == (DdNode *)0x0) {
          pGVar14 = p->pPars;
          if (pGVar14->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation.\n",
                   (ulong)(uint)pGVar14->TimeLimit);
            pGVar14 = p->pPars;
          }
          pGVar14->iFrame = uVar19;
          pDVar18 = p->dd;
          goto LAB_006627db;
        }
        Cudd_Ref(pDVar11);
        Cudd_RecursiveDeref(p->dd,pDVar9);
        n = Extra_TransferPermute(p->dd,p->ddG,pDVar11,Permute_00);
        if (n == (DdNode *)0x0) {
          pGVar14 = p->pPars;
          if (pGVar14->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
                   (ulong)(uint)pGVar14->TimeLimit);
            pGVar14 = p->pPars;
          }
          pGVar14->iFrame = uVar19;
          pDVar18 = p->dd;
LAB_0066272d:
          Cudd_RecursiveDeref(pDVar18,pDVar11);
          pDVar18 = p->ddG;
          goto LAB_006627e7;
        }
        Cudd_Ref(n);
        Cudd_RecursiveDeref(p->dd,pDVar11);
        uVar5 = Cudd_DagSize(n);
        iVar4 = Cudd_bddLeq(p->ddG,n,pDVar10);
        if (iVar4 != 0) {
          Cudd_RecursiveDeref(p->ddG,n);
          pGVar14 = p->pPars;
          if (pDVar10 == (DdNode *)0x0) {
LAB_006627ac:
            pGVar14->iFrame = uVar19;
            return 0;
          }
LAB_006625b3:
          if (pGVar14->fVerbose != 0) {
            dVar21 = Cudd_CountMinterm(p->ddG,pDVar10,p->pAig->nRegs);
            pcVar17 = "Reachability analysis is stopped after %d frames.\n";
            if ((int)uVar16 < p->pPars->nIterMax) {
              pcVar17 = "Reachability analysis completed after %d frames.\n";
            }
            fprintf(_stdout,pcVar17);
            pFVar3 = _stdout;
            dVar22 = ldexp(1.0,p->pAig->nRegs);
            fprintf(pFVar3,"Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar21,
                    (dVar21 * 100.0) / dVar22);
            fflush(_stdout);
            pGVar14 = p->pPars;
          }
          if (pGVar14->fDumpReached != 0) {
            Llb_ManDumpReached(p->ddG,pDVar10,p->pAig->pName,"reached.blif");
            uVar5 = Cudd_DagSize(pDVar10);
            printf("Reached states with %d BDD nodes are dumpted into file \"reached.blif\".\n",
                   (ulong)uVar5);
          }
          Cudd_RecursiveDeref(p->ddG,pDVar10);
          pGVar14 = p->pPars;
          iVar4 = pGVar14->nIterMax;
          if (iVar4 <= (int)uVar16) {
            if (pGVar14->fSilent == 0) {
              printf("Verified only for states reachable in %d frames.  ",(ulong)uVar16);
              aVar8 = Abc_Clock();
              Abc_PrintTime(0x77b9b0,(char *)(aVar8 - aVar7),time_01);
              pGVar14 = p->pPars;
              iVar4 = pGVar14->nIterMax;
            }
            pGVar14->iFrame = iVar4;
            return -1;
          }
          if (pGVar14->fSilent == 0) {
            printf("The miter is proved unreachable after %d iterations.  ",(ulong)uVar16);
            aVar8 = Abc_Clock();
            Abc_PrintTime(0x77b9b0,(char *)(aVar8 - aVar7),time_00);
            pGVar14 = p->pPars;
          }
          pGVar14->iFrame = uVar19;
          return 1;
        }
        pDVar11 = Cudd_bddAnd(p->ddG,n,(DdNode *)((ulong)pDVar10 ^ 1));
        if (pDVar11 == (DdNode *)0x0) {
          pGVar14 = p->pPars;
          if (pGVar14->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation in transfer 2.\n",
                   (ulong)(uint)pGVar14->TimeLimit);
            pGVar14 = p->pPars;
          }
          pGVar14->iFrame = uVar19;
          pDVar18 = p->ddG;
          pDVar11 = n;
          goto LAB_0066272d;
        }
        Cudd_Ref(pDVar11);
        pDVar9 = Extra_TransferPermute(p->ddG,p->dd,pDVar11,Permute);
        if (pDVar9 == (DdNode *)0x0) {
          pGVar14 = p->pPars;
          if (pGVar14->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation in transfer 2.\n",
                   (ulong)(uint)pGVar14->TimeLimit);
            pGVar14 = p->pPars;
          }
          pGVar14->iFrame = uVar19;
          pDVar18 = p->ddG;
          pDVar9 = pDVar11;
          goto LAB_006627db;
        }
        Cudd_Ref(pDVar9);
        Cudd_RecursiveDeref(p->ddG,pDVar11);
        pDVar11 = Cudd_bddOr(p->ddG,pDVar10,n);
        Cudd_Ref(pDVar11);
        Cudd_RecursiveDeref(p->ddG,pDVar10);
        Cudd_RecursiveDeref(p->ddG,n);
        pGVar14 = p->pPars;
        if (pGVar14->fVeryVerbose != 0) {
          dVar21 = Cudd_CountMinterm(p->ddG,pDVar11,p->pAig->nRegs);
          pFVar3 = _stdout;
          dVar22 = ldexp(1.0,p->pAig->nRegs);
          fprintf(pFVar3,"        Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar21,
                  (dVar21 * 100.0) / dVar22);
          fflush(_stdout);
          pGVar14 = p->pPars;
        }
        if (pGVar14->fVerbose != 0) {
          fprintf(_stdout,"F =%3d : ",(ulong)uVar16);
          fprintf(_stdout,"Image =%6d  ",(ulong)uVar5);
          pFVar3 = _stdout;
          uVar5 = Cudd_ReadReorderings(p->dd);
          uVar6 = Cudd_ReadGarbageCollections(p->dd);
          fprintf(pFVar3,"(%4d%4d)  ",(ulong)uVar5,(ulong)uVar6);
          pFVar3 = _stdout;
          uVar5 = Cudd_DagSize(pDVar11);
          fprintf(pFVar3,"Reach =%6d  ",(ulong)uVar5);
          pFVar3 = _stdout;
          uVar5 = Cudd_ReadReorderings(p->ddG);
          uVar6 = Cudd_ReadGarbageCollections(p->ddG);
          fprintf(pFVar3,"(%4d%4d)  ",(ulong)uVar5,(ulong)uVar6);
          aVar12 = Abc_Clock();
          Abc_PrintTime(0x77b9b0,(char *)(aVar12 - aVar8),time);
          pGVar14 = p->pPars;
        }
        iVar4 = pGVar14->nIterMax;
        pDVar10 = pDVar11;
      } while (uVar16 != iVar4 - 1U);
      if (pGVar14->fSilent == 0) {
        printf("Reached limit on the number of timeframes (%d).\n");
        pGVar14 = p->pPars;
      }
      pGVar14->iFrame = uVar19 + 1;
      Cudd_RecursiveDeref(p->dd,pDVar9);
      pDVar18 = p->ddG;
LAB_006627e7:
      Cudd_RecursiveDeref(pDVar18,pDVar10);
      return -1;
    }
LAB_00662499:
    pGVar14 = p->pPars;
    if (pGVar14->fSilent != 0) goto LAB_006624da;
    uVar16 = pGVar14->TimeLimit;
    pcVar17 = "Reached timeout (%d seconds) while computing bad states.\n";
  }
  else {
    if (pDVar9 == (DdNode *)0x0) goto LAB_00662499;
    Cudd_Ref(pDVar9);
    pDVar10 = Llb_CoreComputeCube(p->ddR,p->vVarsCs,0,(char *)0x0);
    p->ddR->bFunc = pDVar10;
    Cudd_Ref(pDVar10);
    pDVar11 = Llb_BddQuantifyPis(p->pInit,p->ddR,pDVar9);
    Cudd_Ref(pDVar11);
    Cudd_RecursiveDeref(p->ddR,pDVar9);
    pDVar10 = Cudd_bddTransfer(p->ddR,p->ddG,pDVar11);
    Cudd_Ref(pDVar10);
    Cudd_RecursiveDeref(p->ddR,pDVar11);
    pDVar11 = Extra_TransferPermute(p->ddG,p->dd,pDVar10,Permute);
    pDVar9 = pDVar11;
    if (pDVar11 != (DdNode *)0x0) goto LAB_006620bc;
    Cudd_RecursiveDeref(p->ddG,pDVar10);
    pGVar14 = p->pPars;
    if (pGVar14->fSilent != 0) goto LAB_006624da;
    uVar16 = pGVar14->TimeLimit;
    pcVar17 = "Reached timeout (%d seconds) during transfer 0.\n";
  }
  printf(pcVar17,(ulong)uVar16);
  pGVar14 = p->pPars;
LAB_006624da:
  pGVar14->iFrame = -1;
  return -1;
}

Assistant:

int Llb_CoreReachability_int( Llb_Img_t * p, Vec_Ptr_t * vQuant0, Vec_Ptr_t * vQuant1 )
{
    int * pLoc2Glo  = p->pPars->fBackward? Vec_IntArray( p->vCs2Glo ) : Vec_IntArray( p->vNs2Glo );
    int * pLoc2GloR = p->pPars->fBackward? Vec_IntArray( p->vNs2Glo ) : Vec_IntArray( p->vCs2Glo );
    int * pGlo2Loc  = p->pPars->fBackward? Vec_IntArray( p->vGlo2Ns ) : Vec_IntArray( p->vGlo2Cs );
    DdNode * bCurrent, * bReached, * bNext, * bTemp;
    abctime clk2, clk = Abc_Clock();
    int nIters, nBddSize;//, iOutFail = -1;
/*
    // compute time to stop
    if ( p->pPars->TimeLimit )
        p->pPars->TimeTarget = Abc_Clock() + p->pPars->TimeLimit * CLOCKS_PER_SEC;
    else
        p->pPars->TimeTarget = 0;
*/

    if ( Abc_Clock() > p->pPars->TimeTarget )
    {
        if ( !p->pPars->fSilent )
            printf( "Reached timeout (%d seconds) before image computation.\n", p->pPars->TimeLimit );
        p->pPars->iFrame = -1;
        return -1;
    }

    // set the stop time parameter
    p->dd->TimeStop  = p->pPars->TimeTarget;
    p->ddG->TimeStop = p->pPars->TimeTarget;
    p->ddR->TimeStop = p->pPars->TimeTarget;

    // compute initial states
    if ( p->pPars->fBackward )
    {
        // create init state in the global manager
        bTemp = Llb_BddComputeBad( p->pInit, p->ddR, p->pPars->TimeTarget );   
        if ( bTemp == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) while computing bad states.\n", p->pPars->TimeLimit );
            p->pPars->iFrame = -1;
            return -1;
        }
        Cudd_Ref( bTemp );
        // create bad state in the ring manager
        p->ddR->bFunc = Llb_CoreComputeCube( p->ddR, p->vVarsCs, 0, NULL );      Cudd_Ref( p->ddR->bFunc );
        bCurrent = Llb_BddQuantifyPis( p->pInit, p->ddR, bTemp );                Cudd_Ref( bCurrent );
        Cudd_RecursiveDeref( p->ddR, bTemp );
        bReached = Cudd_bddTransfer( p->ddR, p->ddG, bCurrent );                 Cudd_Ref( bReached );
        Cudd_RecursiveDeref( p->ddR, bCurrent );
        // move init state to the working manager
        bCurrent = Extra_TransferPermute( p->ddG, p->dd, bReached, pGlo2Loc );   
        if ( bCurrent == NULL )
        {
            Cudd_RecursiveDeref( p->ddG, bReached );
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during transfer 0.\n", p->pPars->TimeLimit );
            p->pPars->iFrame = -1;
            return -1;
        }
        Cudd_Ref( bCurrent );
    }
    else
    {
        // create bad state in the ring manager
        p->ddR->bFunc = Llb_BddComputeBad( p->pInit, p->ddR, p->pPars->TimeTarget );  
        if ( p->ddR->bFunc == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) while computing bad states.\n", p->pPars->TimeLimit );
            p->pPars->iFrame = -1;
            return -1;
        }
        Cudd_Ref( p->ddR->bFunc );
        // create init state in the working and global manager
        bCurrent = Llb_CoreComputeCube( p->dd,  p->vVarsCs, 1, NULL );           Cudd_Ref( bCurrent );
        bReached = Llb_CoreComputeCube( p->ddG, p->vVarsCs, 0, NULL );           Cudd_Ref( bReached );
//Extra_bddPrint( p->dd, bCurrent );  printf( "\n" );
//Extra_bddPrint( p->ddG, bReached );  printf( "\n" );
    }

    // compute onion rings
    for ( nIters = 0; nIters < p->pPars->nIterMax; nIters++ )
    { 
        clk2 = Abc_Clock();
        // check the runtime limit
        if ( p->pPars->TimeLimit && Abc_Clock() > p->pPars->TimeTarget )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            return -1;
        }

        // save the onion ring
        bTemp = Extra_TransferPermute( p->dd, p->ddR, bCurrent, pLoc2GloR );  
        if ( bTemp == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            return -1;
        }
        Cudd_Ref( bTemp );
        Vec_PtrPush( p->vRings, bTemp );

        // check it for bad states
        if ( !p->pPars->fSkipOutCheck && !Cudd_bddLeq( p->ddR, bTemp, Cudd_Not(p->ddR->bFunc) ) ) 
        {
            assert( p->pInit->pSeqModel == NULL );
            if ( !p->pPars->fBackward )
                p->pInit->pSeqModel = Llb_CoreDeriveCex( p ); 
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            if ( !p->pPars->fSilent )
            {
                if ( !p->pPars->fBackward )
                    Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", p->pInit->pSeqModel->iPo, p->pInit->pName, nIters );
                else
                    Abc_Print( 1, "Output ??? was asserted in frame %d (counter-example is not produced).  ", nIters );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            p->pPars->iFrame = nIters - 1;
            return 0;
        }

        // compute the next states
        bNext = Llb_ImgComputeImage( p->pAig, p->vDdMans, p->dd, bCurrent, 
            vQuant0, vQuant1, p->vDriRefs, p->pPars->TimeTarget, 
            p->pPars->fBackward, p->pPars->fReorder, p->pPars->fVeryVerbose );
        if ( bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );   bCurrent = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bNext );
        Cudd_RecursiveDeref( p->dd, bCurrent );        bCurrent = NULL;
//Extra_bddPrintSupport( p->dd, bNext ); printf( "\n" );

        // remap these states into the global manager
//        bNext = Extra_TransferPermute( p->dd, p->ddG, bTemp = bNext, pLoc2Glo );    Cudd_Ref( bNext );
//        Cudd_RecursiveDeref( p->dd, bTemp );

//        bNext = Extra_TransferPermuteTime( p->dd, p->ddG, bTemp = bNext, pLoc2Glo, p->pPars->TimeTarget );    
        bNext = Extra_TransferPermute( p->dd, p->ddG, bTemp = bNext, pLoc2Glo );    
        if ( bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bTemp );  
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bNext );
        Cudd_RecursiveDeref( p->dd, bTemp );  

        nBddSize = Cudd_DagSize(bNext);
        // check if there are any new states
        if ( Cudd_bddLeq( p->ddG, bNext, bReached ) ) // implication = no new states
        {
            Cudd_RecursiveDeref( p->ddG,  bNext );     bNext = NULL;
            break;
        }

        // get the new states
        bCurrent = Cudd_bddAnd( p->ddG, bNext, Cudd_Not(bReached) );                    
        if ( bCurrent == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 2.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->ddG, bNext );  
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bCurrent );

        // remap these states into the current state vars
//        bCurrent = Extra_TransferPermute( p->ddG, p->dd, bTemp = bCurrent, pGlo2Loc );   Cudd_Ref( bCurrent );
//        Cudd_RecursiveDeref( p->ddG, bTemp );

//        bCurrent = Extra_TransferPermuteTime( p->ddG, p->dd, bTemp = bCurrent, pGlo2Loc, p->pPars->TimeTarget );    
        bCurrent = Extra_TransferPermute( p->ddG, p->dd, bTemp = bCurrent, pGlo2Loc );    
        if ( bCurrent == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 2.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->ddG, bTemp );  
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bCurrent );
        Cudd_RecursiveDeref( p->ddG, bTemp );

        // add to the reached states
        bReached = Cudd_bddOr( p->ddG, bTemp = bReached, bNext );                       Cudd_Ref( bReached );
        Cudd_RecursiveDeref( p->ddG, bTemp );
        Cudd_RecursiveDeref( p->ddG, bNext );
        bNext = NULL;

        if ( p->pPars->fVeryVerbose )
        {
            double nMints = Cudd_CountMinterm(p->ddG, bReached, Saig_ManRegNum(p->pAig) );
//            Extra_bddPrint( p->ddG, bReached );printf( "\n" );
            fprintf( stdout, "        Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
            fflush( stdout ); 
        }
        if ( p->pPars->fVerbose )
        {
            fprintf( stdout, "F =%3d : ",    nIters );
            fprintf( stdout, "Image =%6d  ", nBddSize );
            fprintf( stdout, "(%4d%4d)  ", 
                Cudd_ReadReorderings(p->dd),  Cudd_ReadGarbageCollections(p->dd) );
            fprintf( stdout, "Reach =%6d  ", Cudd_DagSize(bReached) );
            fprintf( stdout, "(%4d%4d)  ", 
                Cudd_ReadReorderings(p->ddG), Cudd_ReadGarbageCollections(p->ddG) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );
        }

        // check timeframe limit
        if ( nIters == p->pPars->nIterMax - 1 )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached limit on the number of timeframes (%d).\n",  p->pPars->nIterMax );
            p->pPars->iFrame = nIters;
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            return -1;
        }
    }
    if ( bReached == NULL )
    {
        p->pPars->iFrame = nIters - 1;
        return 0; // reachable
    }
    if ( bCurrent )
        Cudd_RecursiveDeref( p->dd, bCurrent );
    // report the stats
    if ( p->pPars->fVerbose )
    {
        double nMints = Cudd_CountMinterm(p->ddG, bReached, Saig_ManRegNum(p->pAig) );
        if ( nIters >= p->pPars->nIterMax )
            fprintf( stdout, "Reachability analysis is stopped after %d frames.\n", nIters );
        else
            fprintf( stdout, "Reachability analysis completed after %d frames.\n", nIters );
        fprintf( stdout, "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
        fflush( stdout ); 
    }
    if ( p->pPars->fDumpReached )
    {
        Llb_ManDumpReached( p->ddG, bReached, p->pAig->pName, "reached.blif" );
        printf( "Reached states with %d BDD nodes are dumpted into file \"reached.blif\".\n", Cudd_DagSize(bReached) );
    }
    Cudd_RecursiveDeref( p->ddG, bReached );
    if ( nIters >= p->pPars->nIterMax )
    {
        if ( !p->pPars->fSilent )
        {
            printf( "Verified only for states reachable in %d frames.  ", nIters );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        p->pPars->iFrame = p->pPars->nIterMax;
        return -1; // undecided
    }
    if ( !p->pPars->fSilent )
    {
        printf( "The miter is proved unreachable after %d iterations.  ", nIters );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    p->pPars->iFrame = nIters - 1;
    return 1; // unreachable
}